

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::root_directory(path *__return_storage_ptr__,path *this)

{
  path root;
  
  root_name(&root,this);
  if ((root._path._M_string_length < (this->_path)._M_string_length) &&
     ((this->_path)._M_dataplus._M_p[root._path._M_string_length] == '/')) {
    path<char[2],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [2])"/",auto_format);
  }
  else {
    (__return_storage_ptr__->_path)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->_path).field_2;
    (__return_storage_ptr__->_path)._M_string_length = 0;
    (__return_storage_ptr__->_path).field_2._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&root);
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::root_directory() const
{
    path root = root_name();
    if (_path.length() > root._path.length() && _path[root._path.length()] == '/') {
        return path("/");
    }
    return path();
}